

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

void sysbvm_functionDefinition_analyze
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  sysbvm_tuple_t environment_;
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  size_t slotCount;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t captureType;
  size_t i;
  size_t captureCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_8eb22647 gcFrame;
  sysbvm_functionDefinition_t **functionDefinition_local;
  sysbvm_context_t *context_local;
  
  sysbvm_functionDefinition_ensureTypeAnalysis(context,functionDefinition);
  memset(&gcFrameRecord.roots,0,0x30);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)(*functionDefinition)->sourceDefinition;
  sVar4 = (*functionDefinition)->sourceAnalyzedDefinition;
  captureCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(sVar4 + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&captureCount);
  environment_ = *(sysbvm_tuple_t *)(sVar4 + 0x18);
  sVar2 = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
                    (context,gcFrameRecord.roots[6],*(sysbvm_tuple_t *)(sVar4 + 0x40),environment_,
                     *(sysbvm_tuple_t *)(sVar4 + 0x10),(sysbvm_tuple_t *)0x0);
  sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0x98));
  *(sysbvm_tuple_t *)(sVar4 + 0x20) = sVar3;
  sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xa0));
  *(sysbvm_tuple_t *)(sVar4 + 0x28) = sVar3;
  sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xa8));
  *(sysbvm_tuple_t *)(sVar4 + 0x30) = sVar3;
  sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xb0));
  (*functionDefinition)->pragmas = sVar3;
  sVar3 = sysbvm_orderedCollection_asArray(context,*(sysbvm_tuple_t *)(environment_ + 0xb8));
  (*functionDefinition)->innerFunctions = sVar3;
  (*functionDefinition)->primitiveName = *(sysbvm_tuple_t *)(environment_ + 0xc0);
  *(sysbvm_tuple_t *)(sVar4 + 0x48) = sVar2;
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(sVar4 + 0x20));
  sVar2 = sysbvm_array_create(context,slotCount);
  for (captureType = 0; captureType < slotCount; captureType = captureType + 1) {
    sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(sVar4 + 0x20),captureType);
    local_98 = sysbvm_symbolBinding_getType(sVar3);
    if (local_98 == 0) {
      local_98 = (context->roots).untypedType;
    }
    sysbvm_array_atPut(sVar2,captureType,local_98);
  }
  sVar4 = sysbvm_type_createSequenceTupleType(context,sVar2);
  (*functionDefinition)->captureVectorType = sVar4;
  (*functionDefinition)->bytecode = 0;
  (*functionDefinition)->nativeCodeDefinition = 0;
  _Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(environment_ + 200));
  if (!_Var1) {
    (*functionDefinition)->sourceDefinition = 0;
  }
  sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(context,*functionDefinition);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&captureCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return;
}

Assistant:

static void sysbvm_functionDefinition_analyze(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    sysbvm_functionDefinition_ensureTypeAnalysis(context, functionDefinition);

    struct {
        sysbvm_functionSourceDefinition_t *sourceDefinition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
        sysbvm_tuple_t analysisEnvironment;
        sysbvm_functionAnalysisEnvironment_t *analysisEnvironmentObject;
        sysbvm_tuple_t analyzedBodyNode;
        sysbvm_tuple_t captureTypes;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceDefinition = (sysbvm_functionSourceDefinition_t*)(*functionDefinition)->sourceDefinition;
    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)(*functionDefinition)->sourceAnalyzedDefinition;

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.sourceAnalyzedDefinition->sourcePosition);

    gcFrame.analysisEnvironment = gcFrame.sourceAnalyzedDefinition->environment;
    gcFrame.analysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t*)gcFrame.analysisEnvironment;

    gcFrame.analyzedBodyNode = sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(context, gcFrame.sourceDefinition->bodyNode, gcFrame.sourceAnalyzedDefinition->resultTypeNode, gcFrame.analysisEnvironment, gcFrame.sourceAnalyzedDefinition->sourcePosition, NULL);

    gcFrame.sourceAnalyzedDefinition->captures = sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->captureBindingList);
    gcFrame.sourceAnalyzedDefinition->arguments = sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->argumentBindingList);
    gcFrame.sourceAnalyzedDefinition->locals = sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->localBindingList);

    (*functionDefinition)->pragmas = sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->pragmaList);
    (*functionDefinition)->innerFunctions = sysbvm_orderedCollection_asArray(context, gcFrame.analysisEnvironmentObject->innerFunctionList);
    (*functionDefinition)->primitiveName = gcFrame.analysisEnvironmentObject->primitiveName;

    gcFrame.sourceAnalyzedDefinition->bodyNode = gcFrame.analyzedBodyNode;

    size_t captureCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->captures);
    gcFrame.captureTypes = sysbvm_array_create(context, captureCount);
    for(size_t i = 0; i < captureCount; ++i)
    {
        sysbvm_tuple_t captureType = sysbvm_symbolBinding_getType(sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->captures, i));
        if(!captureType)
            captureType = context->roots.untypedType;
        sysbvm_array_atPut(gcFrame.captureTypes, i, captureType);
    }

    (*functionDefinition)->captureVectorType = sysbvm_type_createSequenceTupleType(context, gcFrame.captureTypes);

    (*functionDefinition)->bytecode = SYSBVM_NULL_TUPLE;
    (*functionDefinition)->nativeCodeDefinition = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_boolean_decode(gcFrame.analysisEnvironmentObject->keepSourceDefinition))
        (*functionDefinition)->sourceDefinition = SYSBVM_NULL_TUPLE;

    sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(context, (*functionDefinition));

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}